

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O0

int * immutable::transient_rrb_nth<int,false,6>
                (ref<immutable::transient_rrb<int,_false,_6>_> *trrb,uint32_t index)

{
  int *piVar1;
  ref<immutable::rrb<int,_false,_6>_> local_20;
  uint32_t local_14;
  ref<immutable::transient_rrb<int,_false,_6>_> *prStack_10;
  uint32_t index_local;
  ref<immutable::transient_rrb<int,_false,_6>_> *trrb_local;
  
  local_14 = index;
  prStack_10 = trrb;
  rrb_details::check_transience<int,false,6>(trrb);
  ref<immutable::rrb<int,false,6>>::ref<immutable::transient_rrb<int,false,6>>
            ((ref<immutable::rrb<int,false,6>> *)&local_20,prStack_10);
  piVar1 = rrb_nth<int,false,6>(&local_20,local_14);
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_20);
  return piVar1;
}

Assistant:

inline const T& transient_rrb_nth(const ref<transient_rrb<T, atomic_ref_counting, N>>& trrb, uint32_t index)
    {
    using namespace rrb_details;
    check_transience(trrb);
    return rrb_nth((const ref<rrb<T, atomic_ref_counting, N>>&)trrb, index);
    }